

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_formparse.c
# Opt level: O2

tool_mime *
tool_mime_new_filedata(tool_mime *parent,char *filename,_Bool isremotefile,CURLcode *errcode)

{
  int iVar1;
  ParameterError PVar2;
  char *__ptr;
  tool_mime *ptVar3;
  long lVar4;
  CURLcode CVar5;
  size_t sVar6;
  ulong uVar7;
  char *local_d0;
  size_t stdinsize;
  stat sbuf;
  
  *errcode = CURLE_OUT_OF_MEMORY;
  if ((*filename == '-') && (filename[1] == '\0')) {
    iVar1 = fileno(_stdin);
    local_d0 = (char *)0x0;
    lVar4 = ftell(_stdin);
    if (((lVar4 < 0 || iVar1 < 0) || (iVar1 = fstat64(iVar1,(stat64 *)&sbuf), iVar1 != 0)) ||
       ((sbuf.st_mode & 0xf000) != 0x8000)) {
      stdinsize = 0;
      PVar2 = file2memory(&local_d0,&stdinsize,(FILE *)_stdin);
      if (PVar2 == PARAM_NO_MEM) goto LAB_0010e6f5;
      sVar6 = stdinsize;
      if (PVar2 == PARAM_READ_ERROR) {
        CVar5 = CURLE_READ_ERROR;
      }
      else {
        CVar5 = CURLE_OK;
        if (stdinsize == 0) {
          local_d0 = strdup("");
          if (local_d0 == (char *)0x0) goto LAB_0010e6f5;
          sVar6 = 0;
          CVar5 = CURLE_OK;
        }
      }
      lVar4 = 0;
      uVar7 = sVar6 & 0x7fffffffffffffff;
    }
    else {
      CVar5 = CURLE_OK;
      uVar7 = sbuf.st_size - lVar4;
      if (sbuf.st_size - lVar4 < 1) {
        uVar7 = 0;
      }
    }
    ptVar3 = tool_mime_new(parent,TOOLMIME_STDIN);
    if (ptVar3 == (tool_mime *)0x0) {
      free(local_d0);
    }
    else {
      ptVar3->data = local_d0;
      ptVar3->origin = lVar4;
      ptVar3->size = uVar7;
      ptVar3->curpos = 0;
      if (!isremotefile) {
        ptVar3->kind = TOOLMIME_STDINDATA;
      }
      *errcode = CVar5;
    }
  }
  else {
    __ptr = strdup(filename);
    if (__ptr != (char *)0x0) {
      ptVar3 = tool_mime_new(parent,TOOLMIME_FILE);
      if (ptVar3 != (tool_mime *)0x0) {
        ptVar3->data = __ptr;
        if (!isremotefile) {
          ptVar3->kind = TOOLMIME_FILEDATA;
        }
        *errcode = CURLE_OK;
        return ptVar3;
      }
      free(__ptr);
    }
LAB_0010e6f5:
    ptVar3 = (tool_mime *)0x0;
  }
  return ptVar3;
}

Assistant:

static struct tool_mime *tool_mime_new_filedata(struct tool_mime *parent,
                                                const char *filename,
                                                bool isremotefile,
                                                CURLcode *errcode)
{
  CURLcode result = CURLE_OK;
  struct tool_mime *m = NULL;

  *errcode = CURLE_OUT_OF_MEMORY;
  if(strcmp(filename, "-")) {
    /* This is a normal file. */
    char *filedup = strdup(filename);
    if(filedup) {
      m = tool_mime_new(parent, TOOLMIME_FILE);
      if(!m)
        free(filedup);
      else {
        m->data = filedup;
        if(!isremotefile)
          m->kind = TOOLMIME_FILEDATA;
       *errcode = CURLE_OK;
      }
    }
  }
  else {        /* Standard input. */
#ifdef UNDER_CE
    int fd = STDIN_FILENO;
#else
    int fd = fileno(stdin);
#endif
    char *data = NULL;
    curl_off_t size;
    curl_off_t origin;
    struct_stat sbuf;

    CURL_SET_BINMODE(stdin);
    origin = ftell(stdin);
    /* If stdin is a regular file, do not buffer data but read it
       when needed. */
    if(fd >= 0 && origin >= 0 && !fstat(fd, &sbuf) &&
#ifdef __VMS
       sbuf.st_fab_rfm != FAB$C_VAR && sbuf.st_fab_rfm != FAB$C_VFC &&
#endif
       S_ISREG(sbuf.st_mode)) {
      size = sbuf.st_size - origin;
      if(size < 0)
        size = 0;
    }
    else {  /* Not suitable for direct use, buffer stdin data. */
      size_t stdinsize = 0;

      switch(file2memory(&data, &stdinsize, stdin)) {
      case PARAM_NO_MEM:
        return m;
      case PARAM_READ_ERROR:
        result = CURLE_READ_ERROR;
        break;
      default:
        if(!stdinsize) {
          /* Zero-length data has been freed. Re-create it. */
          data = strdup("");
          if(!data)
            return m;
        }
        break;
      }
      size = uztoso(stdinsize);
      origin = 0;
    }
    m = tool_mime_new(parent, TOOLMIME_STDIN);
    if(!m)
      curlx_safefree(data);
    else {
      m->data = data;
      m->origin = origin;
      m->size = size;
      m->curpos = 0;
      if(!isremotefile)
        m->kind = TOOLMIME_STDINDATA;
      *errcode = result;
    }
  }
  return m;
}